

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_var_to_local.cpp
# Opt level: O3

void __thiscall
optimization::global_var_to_local::Global_Var_to_Local::optimize_mir
          (Global_Var_to_Local *this,MirPackage *mir,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32_t uVar3;
  size_t __n;
  pair<int,_int> pair;
  pair<int,_int> pair_00;
  uint32_t *__k;
  size_type sVar4;
  mapped_type *f;
  Displayable DVar5;
  int iVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  const_iterator cVar9;
  variant_alternative_t<1UL,_variant<VarId,_basic_string<char>_>_> *pvVar10;
  _Base_ptr p_Var11;
  long lVar12;
  ostream *poVar13;
  mapped_type *pmVar14;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *puVar15;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar16;
  mapped_type *pmVar17;
  Inst *pIVar18;
  Inst *pIVar19;
  mapped_type *pmVar20;
  _Base_ptr p_Var21;
  undefined8 uVar22;
  _Base_ptr *this_00;
  Inst *pIVar23;
  _Rb_tree_node_base *this_01;
  ulong uVar24;
  pair<int,_int> *ppVar25;
  long *plVar26;
  _Alloc_hider _Var27;
  Var_Replace vp;
  VarId var;
  VarId val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  VarId dest;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  global_vars;
  string local_258;
  undefined1 local_238 [8];
  _Alloc_hider _Stack_230;
  undefined1 local_228 [24];
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Base_ptr local_1f0;
  bool local_1e8;
  mapped_type *local_1d0;
  ulong local_1c8;
  Displayable local_1c0;
  undefined8 *local_1b8;
  uint32_t local_1b0;
  Displayable local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  undefined1 local_180 [8];
  variant<int,_mir::inst::VarId> local_178;
  undefined1 local_158;
  long *local_150;
  size_t local_148;
  long local_140 [2];
  _func_int **local_130;
  _Base_ptr *local_128;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *local_120;
  Variable local_118;
  key_type local_f8;
  undefined **local_e8;
  _Rb_tree_node_base *local_e0;
  _Base_ptr local_d8;
  _func_int **local_d0;
  undefined **local_c8;
  pair<int,_int> *local_c0;
  Timestamp local_b8;
  VarId local_a0;
  VarId local_90;
  VarId local_80;
  VarId local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var7 = (mir->global_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(mir->global_values)._M_t._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      if (*(char *)&p_Var7[3]._M_parent == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var7 + 1)
                  );
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  p_Var1 = &(mir->functions)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var8 = (mir->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != p_Var1;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    if (*(char *)&p_Var8[3]._M_parent[1]._M_left == '\0') {
      this_01 = p_Var8 + 1;
      iVar6 = std::__cxx11::string::compare((char *)this_01);
      if ((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare((char *)this_01), iVar6 != 0)) {
        optimize_func((Global_Var_to_Local *)this_01,(MirFunction *)(p_Var8 + 2),
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_60);
      }
    }
  }
  local_238 = (undefined1  [8])local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"$$5_main","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          ::find(&(mir->functions)._M_t,(key_type *)local_238);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,local_228._0_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar9._M_node != p_Var1) {
    local_238 = (undefined1  [8])local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"$$5_main","");
    local_1d0 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                ::at(&mir->functions,(key_type *)local_238);
    if (local_238 != (undefined1  [8])local_228) {
      operator_delete((void *)local_238,local_228._0_8_ + 1);
    }
    if ((local_1d0->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var7 = (local_1d0->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_f8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      local_f8.id = 0xffffffff;
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header) {
        this_00 = &p_Var7[3]._M_parent;
        local_120 = &local_1d0->variables;
        local_130 = (_func_int **)&PTR_display_001ecf68;
        local_e8 = &PTR_display_001ed1c8;
        local_1c0._vptr_Displayable = (_func_int **)&PTR_display_001ecf98;
        local_d0 = (_func_int **)&PTR_display_001ed2e8;
        local_1a8._vptr_Displayable = (_func_int **)&PTR_display_001ecfe8;
        local_c8 = &PTR_display_001ed168;
        p_Var21 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        local_128 = this_00;
        local_d8 = p_Var7;
        do {
          local_150 = local_140;
          local_e0 = p_Var21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,*(size_t *)(p_Var21 + 1),
                     (long)&(p_Var21[1]._M_parent)->_M_color + *(size_t *)(p_Var21 + 1));
          p_Var21 = p_Var7[3]._M_parent;
          p_Var11 = p_Var7[3]._M_left;
          if (p_Var11 == p_Var21) {
            local_1c8 = 0;
            uVar24 = 0;
            p_Var21 = p_Var11;
          }
          else {
            uVar24 = 0;
            do {
              plVar26 = *(long **)(&p_Var21->_M_color + uVar24 * 2);
              iVar6 = (**(code **)(*plVar26 + 8))(plVar26);
              if (iVar6 == 2) {
                if ((undefined **)*plVar26 != local_c8) {
                  plVar26 = (long *)0x0;
                }
                if ((char)plVar26[7] == '\x01') {
                  pvVar10 = std::get<1ul,mir::inst::VarId,std::__cxx11::string>
                                      ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)(plVar26 + 3));
                  __n = pvVar10->_M_string_length;
                  if ((__n == local_148) &&
                     ((__n == 0 ||
                      (iVar6 = bcmp((pvVar10->_M_dataplus)._M_p,local_150,__n), iVar6 == 0)))) {
                    local_f8.id = *(uint32_t *)(plVar26 + 2);
                    p_Var21 = p_Var7[3]._M_parent;
                    p_Var11 = p_Var7[3]._M_left;
                    break;
                  }
                }
              }
              uVar24 = uVar24 + 1;
              p_Var21 = p_Var7[3]._M_parent;
              p_Var11 = p_Var7[3]._M_left;
            } while (uVar24 < (ulong)((long)p_Var11 - (long)p_Var21 >> 3));
            local_1c8 = uVar24 & 0xffffffff;
          }
          if ((long)p_Var11 - (long)p_Var21 >> 3 != uVar24) {
            ::mir::types::new_int_ty();
            f = local_1d0;
            _Var27._M_p = _Stack_230._M_p;
            local_118.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_238;
            local_238 = (undefined1  [8])0x0;
            _Stack_230._M_p = (pointer)0x0;
            local_118.super_Displayable._vptr_Displayable = local_130;
            local_118.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var27._M_p;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var27._M_p !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(_Var27._M_p + 8) = *(int *)(_Var27._M_p + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(_Var27._M_p + 8) = *(int *)(_Var27._M_p + 8) + 1;
              }
            }
            local_118.is_memory_var = false;
            local_118.is_temp_var = false;
            local_118.is_phi_var = false;
            local_118.priority = 0;
            get_new_id((global_var_to_local *)&local_1b8,f,&local_118);
            local_118.super_Displayable._vptr_Displayable = local_130;
            if (local_118.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_118.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var27._M_p !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var27._M_p);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_230._M_p !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_230._M_p);
            }
            if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) ==
                 0) || (plVar26 = (long *)__dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::
                                                                    vtable +
                                                                  *(long *)(std::clog + -0x18)),
                                                         &std::streambuf::typeinfo,
                                                         &AixLog::Log::typeinfo),
                       plVar26 == (long *)0x0)) {
              _Stack_230._M_p = (pointer)0x5;
              local_228._0_6_ = 0x6563617254;
              local_238 = (undefined1  [8])local_228;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,(char *)local_228,5);
              if (local_238 != (undefined1  [8])local_228) {
                operator_delete((void *)local_238,local_228._0_8_ + 1);
              }
LAB_00157894:
              local_180 = (undefined1  [8])&PTR__Tag_001eaf88;
              local_178.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ =
                   &local_178.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
              local_178.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ = 0;
              local_178.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = '\0';
              local_158 = 1;
              if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18))
                   == 0) ||
                 (lVar12 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                                   *(long *)(std::clog + -0x18)),
                                          &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0),
                 lVar12 == 0)) {
LAB_00157948:
                local_b8.time_point.__d.__r = (duration)std::chrono::_V2::system_clock::now();
                local_b8._vptr_Timestamp = (_func_int **)&PTR__Timestamp_001eaf58;
                local_b8.is_null_ = false;
                if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)
                              ) == 0) ||
                   (lVar12 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                                     *(long *)(std::clog + -0x18)),
                                            &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0),
                   lVar12 == 0)) {
                  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                  local_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x15;
                  local_258._M_dataplus._M_p =
                       (pointer)std::__cxx11::string::_M_create
                                          ((ulong *)&local_258,(ulong)&local_1a0);
                  local_258.field_2._M_allocated_capacity = (size_type)local_1a0;
                  builtin_strncpy(local_258._M_dataplus._M_p,"%Y-%m-%d %H-%M-%S.#ms",0x15);
                  local_258._M_string_length = (size_type)local_1a0;
                  local_258._M_dataplus._M_p[(long)local_1a0] = '\0';
                  AixLog::Timestamp::to_string((string *)local_238,&local_b8,&local_258);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::clog,(char *)local_238,(long)_Stack_230._M_p);
                  if (local_238 != (undefined1  [8])local_228) {
                    operator_delete((void *)local_238,local_228._0_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_dataplus._M_p != &local_258.field_2) {
                    operator_delete(local_258._M_dataplus._M_p,
                                    local_258.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  iVar6 = pthread_mutex_lock((pthread_mutex_t *)(lVar12 + 0x148));
                  if (iVar6 != 0) goto LAB_0015828a;
                  *(bool *)(lVar12 + 0x120) = local_b8.is_null_;
                  ((duration *)(lVar12 + 0x118))->__r = (rep)local_b8.time_point.__d.__r;
                  pthread_mutex_unlock((pthread_mutex_t *)(lVar12 + 0x148));
                }
                local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_258,"optimize_mir","");
                local_1a0 = &local_190;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/global_var_to_local.cpp"
                           ,"");
                sVar4 = local_258._M_string_length;
                local_238 = (undefined1  [8])&PTR__Function_001eafb8;
                paVar2 = &local_258.field_2;
                local_210._M_p = (pointer)&local_200;
                _Var27._M_p = local_258._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p == paVar2) {
                  local_228._16_4_ = local_258.field_2._8_4_;
                  local_228._20_4_ = local_258.field_2._12_4_;
                  _Var27._M_p = (pointer)(local_228 + 8);
                }
                local_228._8_8_ = local_258.field_2._M_allocated_capacity;
                local_228._0_8_ = local_258._M_string_length;
                local_258._M_string_length = 0;
                local_258.field_2._M_allocated_capacity =
                     local_258.field_2._M_allocated_capacity & 0xffffffffffffff00;
                if (local_1a0 == &local_190) {
                  local_200._8_4_ = local_190._8_4_;
                  local_200._12_4_ = local_190._12_4_;
                }
                else {
                  local_210._M_p = (pointer)local_1a0;
                }
                local_200._M_allocated_capacity._4_4_ = local_190._M_allocated_capacity._4_4_;
                local_200._M_allocated_capacity._0_4_ = local_190._M_allocated_capacity._0_4_;
                local_208 = local_198;
                local_198 = 0;
                local_190._M_allocated_capacity._0_4_ =
                     local_190._M_allocated_capacity._0_4_ & 0xffffff00;
                local_1f0 = (_Base_ptr)0x55;
                local_1e8 = false;
                local_258._M_dataplus._M_p = (pointer)paVar2;
                _Stack_230._M_p = _Var27._M_p;
                local_1a0 = &local_190;
                if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)
                              ) == 0) ||
                   (lVar12 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                                     *(long *)(std::clog + -0x18)),
                                            &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0),
                   lVar12 == 0)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::clog,_Var27._M_p,sVar4);
                }
                else {
                  iVar6 = pthread_mutex_lock((pthread_mutex_t *)(lVar12 + 0x148));
                  if (iVar6 != 0) goto LAB_0015827c;
                  std::__cxx11::string::_M_assign((string *)(lVar12 + 0xc0));
                  std::__cxx11::string::_M_assign((string *)(lVar12 + 0xe0));
                  *(bool *)(lVar12 + 0x108) = local_1e8;
                  *(_Base_ptr *)(lVar12 + 0x100) = local_1f0;
                  pthread_mutex_unlock((pthread_mutex_t *)(lVar12 + 0x148));
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::clog,"convert global var  ",0x14);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::clog,(char *)local_150,local_148);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," to local var ",0xe);
                (*(code *)*local_1b8)(&local_1b8,poVar13);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," in ",4);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(local_1d0->name)._M_dataplus._M_p,
                                     (local_1d0->name)._M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
                AixLog::Function::~Function((Function *)local_238);
                if (local_1a0 != &local_190) {
                  operator_delete(local_1a0,
                                  CONCAT44(local_190._M_allocated_capacity._4_4_,
                                           local_190._M_allocated_capacity._0_4_) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                  operator_delete(local_258._M_dataplus._M_p,
                                  local_258.field_2._M_allocated_capacity + 1);
                }
                local_180 = (undefined1  [8])&PTR__Tag_001eaf88;
                if ((__index_type *)
                    local_178.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ !=
                    &local_178.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._M_index) {
                  operator_delete((void *)local_178.super__Variant_base<int,_mir::inst::VarId>.
                                          super__Move_assign_alias<int,_mir::inst::VarId>.
                                          super__Copy_assign_alias<int,_mir::inst::VarId>.
                                          super__Move_ctor_alias<int,_mir::inst::VarId>.
                                          super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                          super__Variant_storage_alias<int,_mir::inst::VarId>._M_u.
                                          _0_8_,
                                  CONCAT53(local_178.super__Variant_base<int,_mir::inst::VarId>.
                                           super__Move_assign_alias<int,_mir::inst::VarId>.
                                           super__Copy_assign_alias<int,_mir::inst::VarId>.
                                           super__Move_ctor_alias<int,_mir::inst::VarId>.
                                           super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                           super__Variant_storage_alias<int,_mir::inst::VarId>.
                                           _19_5_,CONCAT21(local_178.
                                                                                                                      
                                                  super__Variant_base<int,_mir::inst::VarId>.
                                                  super__Move_assign_alias<int,_mir::inst::VarId>.
                                                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                                                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                                                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                                  super__Variant_storage_alias<int,_mir::inst::VarId>
                                                  ._17_2_,local_178.
                                                          super__Variant_base<int,_mir::inst::VarId>
                                                          .
                                                  super__Move_assign_alias<int,_mir::inst::VarId>.
                                                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                                                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                                                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                                  super__Variant_storage_alias<int,_mir::inst::VarId>
                                                  ._M_index)) + 1);
                }
                p_Var21 = *this_00;
                local_238 = (undefined1  [8])operator_new(0x38);
                *(undefined ***)((long)local_238 + 8) = &PTR_display_001eb100;
                *(uint32_t *)((long)local_238 + 0x10) = local_1b0;
                *(undefined ***)local_238 = local_e8;
                *(undefined1 *)((long)local_238 + 0x30) = 1;
                *(undefined ***)((long)local_238 + 0x20) = &PTR_display_001eb100;
                *(uint32_t *)((long)local_238 + 0x28) = local_f8.id;
                *(_func_int ***)((long)local_238 + 0x18) = local_1c0._vptr_Displayable;
                *(undefined2 *)((long)local_238 + 0x31) = 1;
                std::
                vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ::_M_insert_rval((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                  *)this_00,
                                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  *)(&p_Var21->_M_parent + uVar24),(value_type *)local_238);
                if (local_238 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_238 + 0x28))();
                }
                var_replace::Var_Replace::Var_Replace((Var_Replace *)local_238,local_1d0);
                pmVar14 = std::
                          map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                          ::at((map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                                *)&_Stack_230,&local_f8);
                ppVar25 = (pmVar14->
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                local_c0 = (pmVar14->
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                if (ppVar25 != local_c0) {
                  local_1c8 = (ulong)((int)local_1c8 + 1);
                  do {
                    if ((ppVar25->first != *(int *)&p_Var7[1]._M_left) ||
                       (ppVar25->second != (int)local_1c8)) {
                      puVar15 = var_replace::Var_Replace::get_usepoint
                                          ((Var_Replace *)local_238,*ppVar25);
                      iVar6 = (*(((puVar15->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                                super_Displayable)._vptr_Displayable[1])();
                      pIVar23 = (puVar15->_M_t).
                                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                      if (iVar6 == 4) {
                        if ((pIVar23->super_Displayable)._vptr_Displayable != local_d0) {
                          pIVar23 = (Inst *)0x0;
                        }
                        if (*(char *)&pIVar23[2].super_Displayable._vptr_Displayable != '\0') {
                          pvVar16 = std::get<1ul,int,mir::inst::VarId>
                                              ((variant<int,_mir::inst::VarId> *)&pIVar23[1].dest);
                          pmVar17 = std::
                                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                    ::at(local_120,&pvVar16->id);
                          if (pmVar17->is_phi_var == false) {
                            pvVar16 = std::get<1ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)&pIVar23[1].dest)
                            ;
                            local_180 = (undefined1  [8])&PTR_display_001eb100;
                            local_70.id = pvVar16->id;
                            local_178.super__Variant_base<int,_mir::inst::VarId>.
                            super__Move_assign_alias<int,_mir::inst::VarId>.
                            super__Copy_assign_alias<int,_mir::inst::VarId>.
                            super__Move_ctor_alias<int,_mir::inst::VarId>.
                            super__Copy_ctor_alias<int,_mir::inst::VarId>.
                            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first.
                            _M_storage = (_Uninitialized<int,_true>)local_70.id;
                            local_70.super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001eb100;
                            local_80.super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001eb100;
                            local_80.id = local_1b0;
                            var_replace::Var_Replace::replace
                                      ((Var_Replace *)local_238,&local_70,&local_80);
                            pIVar18 = (Inst *)operator_new(0x38);
                            (pIVar18->dest).super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001eb100;
                            (pIVar18->dest).id = local_1b0;
                            (pIVar18->super_Displayable)._vptr_Displayable =
                                 local_1a8._vptr_Displayable;
                            *(undefined1 *)&pIVar18[2].super_Displayable._vptr_Displayable = 1;
                            pIVar18[1].dest.super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001eb100;
                            pIVar18[1].dest.id = local_1b0;
                            pIVar18[1].super_Displayable._vptr_Displayable =
                                 local_1c0._vptr_Displayable;
                            *(undefined2 *)
                             ((long)&pIVar18[2].super_Displayable._vptr_Displayable + 1) = 1;
                            pIVar23 = (puVar15->_M_t).
                                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                            (puVar15->_M_t).
                            super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                            .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pIVar18;
                            if (pIVar23 != (Inst *)0x0) {
                              (*(pIVar23->super_Displayable)._vptr_Displayable[5])();
                            }
                            pmVar20 = std::
                                      map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                                      ::at((map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                                            *)&local_200,(key_type *)local_180);
                            pair_00.first = pmVar20->first;
                            pair_00.second = pmVar20->second;
                            puVar15 = var_replace::Var_Replace::get_usepoint
                                                ((Var_Replace *)local_238,pair_00);
                            goto LAB_001581dd;
                          }
                        }
                        pIVar18 = (Inst *)operator_new(0x38);
                        uVar3 = local_1b0;
                        local_178.super__Variant_base<int,_mir::inst::VarId>.
                        super__Move_assign_alias<int,_mir::inst::VarId>.
                        super__Copy_assign_alias<int,_mir::inst::VarId>.
                        super__Move_ctor_alias<int,_mir::inst::VarId>.
                        super__Copy_ctor_alias<int,_mir::inst::VarId>.
                        super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                             *(__index_type *)&pIVar23[2].super_Displayable._vptr_Displayable;
                        local_258._M_dataplus._M_p = (pointer)&local_178;
                        (*std::__detail::__variant::
                          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                          ::_S_vtable._M_arr
                          [(long)(char)local_178.super__Variant_base<int,_mir::inst::VarId>.
                                       super__Move_assign_alias<int,_mir::inst::VarId>.
                                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index
                           + 1]._M_data)((anon_class_8_1_a78179b7_conflict *)&local_258,
                                         (variant<int,_mir::inst::VarId> *)&pIVar23[1].dest);
                        DVar5._vptr_Displayable = local_1c0._vptr_Displayable;
                        local_180 = (undefined1  [8])local_1c0._vptr_Displayable;
                        local_178.super__Variant_base<int,_mir::inst::VarId>.
                        super__Move_assign_alias<int,_mir::inst::VarId>.
                        super__Copy_assign_alias<int,_mir::inst::VarId>.
                        super__Move_ctor_alias<int,_mir::inst::VarId>.
                        super__Copy_ctor_alias<int,_mir::inst::VarId>.
                        super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                             *(undefined2 *)
                              ((long)&pIVar23[2].super_Displayable._vptr_Displayable + 1);
                        (pIVar18->dest).super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001eb100;
                        (pIVar18->dest).id = uVar3;
                        (pIVar18->super_Displayable)._vptr_Displayable = local_1a8._vptr_Displayable
                        ;
                        local_258._M_dataplus._M_p = (pointer)&pIVar18[1].dest;
                        *(__index_type *)&pIVar18[2].super_Displayable._vptr_Displayable =
                             local_178.super__Variant_base<int,_mir::inst::VarId>.
                             super__Move_assign_alias<int,_mir::inst::VarId>.
                             super__Copy_assign_alias<int,_mir::inst::VarId>.
                             super__Move_ctor_alias<int,_mir::inst::VarId>.
                             super__Copy_ctor_alias<int,_mir::inst::VarId>.
                             super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                        (*std::__detail::__variant::
                          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                          ::_S_vtable._M_arr
                          [(long)(char)local_178.super__Variant_base<int,_mir::inst::VarId>.
                                       super__Move_assign_alias<int,_mir::inst::VarId>.
                                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index
                           + 1]._M_data)((anon_class_8_1_a78179b7_conflict *)&local_258,&local_178);
                        pIVar18[1].super_Displayable._vptr_Displayable = DVar5._vptr_Displayable;
                        *(undefined2 *)((long)&pIVar18[2].super_Displayable._vptr_Displayable + 1) =
                             local_178.super__Variant_base<int,_mir::inst::VarId>.
                             super__Move_assign_alias<int,_mir::inst::VarId>.
                             super__Copy_assign_alias<int,_mir::inst::VarId>.
                             super__Move_ctor_alias<int,_mir::inst::VarId>.
                             super__Copy_ctor_alias<int,_mir::inst::VarId>.
                             super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                        pIVar23 = (puVar15->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                        (puVar15->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pIVar18;
                        this_00 = local_128;
                        p_Var7 = local_d8;
                      }
                      else {
                        __k = &(pIVar23->dest).id;
                        pmVar17 = std::
                                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  ::at(local_120,__k);
                        if (pmVar17->is_phi_var == false) {
                          local_90.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001eb100;
                          local_90.id = *__k;
                          local_a0.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001eb100;
                          local_a0.id = local_1b0;
                          var_replace::Var_Replace::replace
                                    ((Var_Replace *)local_238,&local_90,&local_a0);
                          pIVar19 = (Inst *)operator_new(0x38);
                          (pIVar19->dest).super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001eb100;
                          (pIVar19->dest).id = local_1b0;
                          (pIVar19->super_Displayable)._vptr_Displayable =
                               local_1a8._vptr_Displayable;
                          *(undefined1 *)&pIVar19[2].super_Displayable._vptr_Displayable = 1;
                          pIVar19[1].dest.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001eb100;
                          pIVar19[1].dest.id = local_1b0;
                          pIVar19[1].super_Displayable._vptr_Displayable =
                               local_1c0._vptr_Displayable;
                          *(undefined2 *)((long)&pIVar19[2].super_Displayable._vptr_Displayable + 1)
                               = 1;
                          pIVar18 = (puVar15->_M_t).
                                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                          (puVar15->_M_t).
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pIVar19;
                          if (pIVar18 != (Inst *)0x0) {
                            (*(pIVar18->super_Displayable)._vptr_Displayable[5])();
                          }
                          pmVar20 = std::
                                    map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                                    ::at((map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                                          *)&local_200,&pIVar23->dest);
                          pair.first = pmVar20->first;
                          pair.second = pmVar20->second;
                          puVar15 = var_replace::Var_Replace::get_usepoint
                                              ((Var_Replace *)local_238,pair);
LAB_001581dd:
                          (((puVar15->_M_t).
                            super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                            .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id
                               = local_1b0;
                          goto LAB_001581ea;
                        }
                        pIVar18 = (Inst *)operator_new(0x38);
                        uVar3 = *__k;
                        (pIVar18->dest).super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001eb100;
                        (pIVar18->dest).id = uVar3;
                        (pIVar18->super_Displayable)._vptr_Displayable = local_1a8._vptr_Displayable
                        ;
                        *(undefined1 *)&pIVar18[2].super_Displayable._vptr_Displayable = 1;
                        pIVar18[1].dest.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001eb100;
                        pIVar18[1].dest.id = local_1b0;
                        pIVar18[1].super_Displayable._vptr_Displayable = local_1c0._vptr_Displayable
                        ;
                        *(undefined2 *)((long)&pIVar18[2].super_Displayable._vptr_Displayable + 1) =
                             1;
                        pIVar23 = (puVar15->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                        (puVar15->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pIVar18;
                      }
                      if (pIVar23 != (Inst *)0x0) {
                        (*(pIVar23->super_Displayable)._vptr_Displayable[5])();
                      }
                    }
LAB_001581ea:
                    ppVar25 = ppVar25 + 1;
                  } while (ppVar25 != local_c0);
                }
                std::
                _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                             *)&local_200);
                std::
                _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                             *)&_Stack_230);
                goto LAB_00158210;
              }
              iVar6 = pthread_mutex_lock((pthread_mutex_t *)(lVar12 + 0x148));
              if (iVar6 == 0) {
                std::__cxx11::string::_M_assign((string *)(lVar12 + 0x90));
                *(undefined1 *)(lVar12 + 0xb0) = local_158;
                pthread_mutex_unlock((pthread_mutex_t *)(lVar12 + 0x148));
                goto LAB_00157948;
              }
            }
            else {
              iVar6 = pthread_mutex_lock((pthread_mutex_t *)(plVar26 + 0x29));
              if (iVar6 == 0) {
                if ((char)plVar26[0x10] != '\0') {
                  (**(code **)(*plVar26 + 0x30))(plVar26);
                  *(undefined1 *)(plVar26 + 0x10) = 0;
                  plVar26[0x23] = 0;
                  *(undefined1 *)(plVar26 + 0x24) = 1;
                  local_238 = (undefined1  [8])&PTR__Tag_001eaf88;
                  local_228._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
                  local_210._M_p._0_1_ = 1;
                  _Stack_230._M_p = (pointer)(local_228 + 8);
                  std::__cxx11::string::_M_assign((string *)(plVar26 + 0x12));
                  *(undefined1 *)(plVar26 + 0x16) = local_210._M_p._0_1_;
                  local_238 = (undefined1  [8])&PTR__Tag_001eaf88;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_230._M_p !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8)) {
                    operator_delete(_Stack_230._M_p,local_228._8_8_ + 1);
                  }
                  AixLog::Function::Function((Function *)local_238,(nullptr_t)0x0);
                  this_00 = local_128;
                  std::__cxx11::string::_M_assign((string *)(plVar26 + 0x18));
                  std::__cxx11::string::_M_assign((string *)(plVar26 + 0x1c));
                  *(bool *)(plVar26 + 0x21) = local_1e8;
                  plVar26[0x20] = (long)local_1f0;
                  AixLog::Function::~Function((Function *)local_238);
                  *(undefined1 *)(plVar26 + 0x25) = 1;
                }
                pthread_mutex_unlock((pthread_mutex_t *)(plVar26 + 0x29));
                goto LAB_00157894;
              }
              iVar6 = std::__throw_system_error(iVar6);
LAB_0015827c:
              iVar6 = std::__throw_system_error(iVar6);
            }
            iVar6 = std::__throw_system_error(iVar6);
LAB_0015828a:
            uVar22 = std::__throw_system_error(iVar6);
            if (local_238 != (undefined1  [8])p_Var7) {
              operator_delete((void *)local_238,local_228._0_8_ + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_60);
            _Unwind_Resume(uVar22);
          }
LAB_00158210:
          if (local_150 != local_140) {
            operator_delete(local_150,local_140[0] + 1);
          }
          p_Var21 = (_Base_ptr)std::_Rb_tree_increment(local_e0);
        } while ((_Rb_tree_header *)p_Var21 != &local_60._M_impl.super__Rb_tree_header);
      }
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void Global_Var_to_Local::optimize_mir(
    mir::inst::MirPackage& mir,
    std::map<std::string, std::any>& extra_data_repo) {
  std::set<std::string> global_vars;
  for (auto& p : mir.global_values) {
    if (p.second.index() == 0) {
      global_vars.insert(p.first);
    }
  }
  for (auto& f : mir.functions) {
    if (f.second.type->is_extern || f.first == "$$5_main" || f.first == "main")
      continue;
    optimize_func(f.second, global_vars);
  }
  if (!mir.functions.count("$$5_main")) {
    return;
  }
  auto& f = mir.functions.at("$$5_main");
  if (!f.basic_blks.size()) {
    return;
  }
  auto& startblk = f.basic_blks.begin()->second;
  mir::inst::VarId dest;
  for (auto s : global_vars) {
    int idx = 0;
    for (; idx < startblk.inst.size(); idx++) {
      auto& inst = startblk.inst.at(idx);
      auto& i = *inst;
      if (inst->inst_kind() == mir::inst::InstKind::Ref) {
        auto ref = dynamic_cast<mir::inst::RefInst*>(&i);
        if (ref->val.index() == 1 && std::get<std::string>(ref->val) == s) {
          dest = ref->dest;
          break;
        }
      }
    }
    if (idx == startblk.inst.size()) {
      continue;
    }
    auto var = get_new_id(f, mir::inst::Variable(mir::types::new_int_ty()));
    LOG(TRACE) << "convert global var  " << s << " to local var " << var
               << " in " << f.name << std::endl;
    startblk.inst.insert(startblk.inst.begin() + idx + 1,
                         std::make_unique<mir::inst::LoadInst>(dest, var));
    var_replace::Var_Replace vp(f);
    for (auto& usepoint : vp.usepoints.at(dest)) {
      if (usepoint.first == startblk.id && usepoint.second == idx + 1) {
        continue;
      }
      auto& inst = vp.get_usepoint(usepoint);
      if (inst->inst_kind() == mir::inst::InstKind::Store) {
        auto& i = *inst;
        auto ist = dynamic_cast<mir::inst::StoreOffsetInst*>(&i);
        if (!ist->val.is_immediate() &&
            !f.variables.at(std::get<mir::inst::VarId>(ist->val).id)
                 .is_phi_var) {
          auto val = std::get<mir::inst::VarId>(ist->val);
          vp.replace(val, var);
          inst = std::make_unique<mir::inst::AssignInst>(var, var);
          auto& def = vp.get_usepoint(vp.defpoint.at(val));
          def->dest = var;
        } else {
          inst = std::make_unique<mir::inst::AssignInst>(var, ist->val);
        }
      } else {
        auto& i = *inst;
        auto ist = dynamic_cast<mir::inst::LoadOffsetInst*>(&i);
        if (!f.variables.at(ist->dest.id).is_phi_var) {
          vp.replace(ist->dest, var);
          inst = std::make_unique<mir::inst::AssignInst>(var, var);
          auto& def = vp.get_usepoint(vp.defpoint.at(ist->dest));
          def->dest = var;
        } else {
          inst = std::make_unique<mir::inst::AssignInst>(ist->dest, var);
        }
      }
    }
  }
}